

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::property_value::resolve_type(property_value *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  value_type vVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  uint local_38;
  
  if (this->type == UNKNOWN) {
    pbVar8 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar8 == pbVar2) {
      vVar4 = STRING;
    }
    else {
      vVar4 = BINARY;
      if (pbVar2[-1] == 0) {
        iVar9 = (int)pbVar2;
        iVar7 = (int)pbVar8;
        bVar3 = false;
        local_38 = 0;
        do {
          bVar6 = true;
          while( true ) {
            if (pbVar8 == pbVar2) {
              if (bVar6) {
                vVar4 = BINARY;
                if (iVar9 != iVar7 && iVar9 - iVar7 <= (int)local_38) goto LAB_0012bc5b;
              }
              else {
                vVar4 = BINARY;
                if (iVar9 != iVar7) goto LAB_0012bc5b;
              }
              vVar4 = (value_type)(local_38 < 2);
              goto LAB_0012bc5b;
            }
            bVar1 = *pbVar8;
            if (bVar1 == 0) break;
            iVar5 = isprint((uint)bVar1);
            if (iVar5 == 0) {
              bVar6 = false;
            }
            pbVar8 = pbVar8 + 1;
            bVar3 = bVar1 == 0;
            if (!bVar6) goto LAB_0012bc54;
          }
          if (bVar3) break;
          local_38 = local_38 + 1;
          pbVar8 = pbVar8 + 1;
          bVar3 = true;
        } while (bVar6);
LAB_0012bc54:
        vVar4 = BINARY;
      }
    }
LAB_0012bc5b:
    this->type = vVar4;
  }
  return;
}

Assistant:

void
property_value::resolve_type()
{
	if (type != UNKNOWN)
	{
		return;
	}
	if (byte_data.empty())
	{
		type = STRING;
		return;
	}
	if (byte_data.back() == 0)
	{
		bool is_all_printable = true;
		int nuls = 0;
		int bytes = 0;
		bool lastWasNull = false;
		for (auto i : byte_data)
		{
			bytes++;
			is_all_printable &= (i == '\0') || isprint(i);
			if (i == '\0')
			{
				// If there are two nulls in a row, then we're probably binary.
				if (lastWasNull)
				{
					type = BINARY;
					return;
				}
				nuls++;
				lastWasNull = true;
			}
			else
			{
				lastWasNull = false;
			}
			if (!is_all_printable)
			{
				break;
			}
		}
		if ((is_all_printable && (bytes > nuls)) || bytes == 0)
		{
			type = STRING;
			if (nuls > 1)
			{
				type = STRING_LIST;
			}
			return;
		}
	}
	type = BINARY;
}